

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_PCM.cpp
# Opt level: O3

h__Writer * __thiscall
ASDCP::PCM::MXFWriter::h__Writer::SetSourceStream(h__Writer *this,AudioDescriptor *ADesc)

{
  AudioDescriptor *ADesc_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  Rational RVar6;
  Rational RVar7;
  i32_t iVar8;
  i32_t iVar9;
  i32_t iVar10;
  i32_t iVar11;
  i32_t iVar12;
  i32_t iVar13;
  i32_t iVar14;
  ui32_t BytesPerEditUnit;
  MDDEntry *pMVar15;
  ILogSink *this_00;
  Rational *in_RDX;
  undefined1 *puVar16;
  char *fmt;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined **local_100;
  Rational local_f8;
  undefined1 local_f0 [17];
  undefined8 uStack_df;
  undefined1 local_d0 [17];
  Rational RStack_bf;
  string local_b0;
  
  if (ADesc[0x12].Locked == 1) {
    iVar1 = in_RDX->Numerator;
    iVar2 = in_RDX->Denominator;
    if (((((((ASDCP::EditRate_24 == iVar1) && (DAT_00250e24 == iVar2)) ||
           ((ASDCP::EditRate_25 == iVar1 && (DAT_00250e4c == iVar2)))) ||
          (((ASDCP::EditRate_30 == iVar1 && (DAT_00250e54 == iVar2)) ||
           ((ASDCP::EditRate_48 == iVar1 && (DAT_00250e34 == iVar2)))))) ||
         (((((ASDCP::EditRate_50 == iVar1 && (DAT_00250e5c == iVar2)) ||
            ((ASDCP::EditRate_60 == iVar1 && (DAT_00250e64 == iVar2)))) ||
           (((ASDCP::EditRate_96 == iVar1 && (DAT_00250e6c == iVar2)) ||
            ((ASDCP::EditRate_100 == iVar1 && (DAT_00250e74 == iVar2)))))) ||
          (((((ASDCP::EditRate_120 == iVar1 && (DAT_00250e7c == iVar2)) ||
             ((ASDCP::EditRate_192 == iVar1 && (DAT_00250e84 == iVar2)))) ||
            ((ASDCP::EditRate_200 == iVar1 && (DAT_00250e8c == iVar2)))) ||
           (((ASDCP::EditRate_240 == iVar1 && (DAT_00250e94 == iVar2)) ||
            ((((ASDCP::EditRate_16 == iVar1 && (DAT_00250e9c == iVar2)) ||
              ((ASDCP::EditRate_18 == iVar1 && (DAT_00250ea4 == iVar2)))) ||
             ((ASDCP::EditRate_20 == iVar1 && (DAT_00250eac == iVar2)))))))))))) ||
        ((ASDCP::EditRate_22 == iVar1 && (DAT_00250eb4 == iVar2)))) ||
       ((ASDCP::EditRate_23_98 == iVar1 && (DAT_00250e2c == iVar2)))) {
      if (((ASDCP::SampleRate_48k == in_RDX[1].Numerator) && (DAT_00250e3c == in_RDX[1].Denominator)
          ) || ((ASDCP::SampleRate_96k == in_RDX[1].Numerator &&
                (DAT_00250e44 == in_RDX[1].Denominator)))) {
        if (ADesc->AudioSamplingRate == (Rational)0x0) {
          __assert_fail("m_Dict",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_PCM.cpp"
                        ,0x25a,
                        "ASDCP::Result_t ASDCP::PCM::MXFWriter::h__Writer::SetSourceStream(const AudioDescriptor &)"
                       );
        }
        ADesc_00 = ADesc + 0x25;
        RVar6 = *in_RDX;
        RVar7 = in_RDX[1];
        iVar11 = in_RDX[2].Numerator;
        iVar12 = in_RDX[2].Denominator;
        iVar13 = in_RDX[3].Numerator;
        iVar14 = in_RDX[3].Denominator;
        iVar8 = in_RDX[4].Denominator;
        iVar9 = in_RDX[5].Numerator;
        iVar10 = in_RDX[5].Denominator;
        ADesc[0x25].AvgBps = in_RDX[4].Numerator;
        ADesc[0x25].LinkedTrackID = iVar8;
        ADesc[0x25].ContainerDuration = iVar9;
        ADesc[0x25].ChannelFormat = iVar10;
        ADesc[0x25].Locked = iVar11;
        ADesc[0x25].ChannelCount = iVar12;
        ADesc[0x25].QuantizationBits = iVar13;
        ADesc[0x25].BlockAlign = iVar14;
        ADesc[0x25].EditRate = RVar6;
        ADesc[0x25].AudioSamplingRate = RVar7;
        PCM_ADesc_to_MD((ASDCP *)this,ADesc_00,
                        *(WaveAudioDescriptor **)&ADesc[0x10].QuantizationBits);
        if (*(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                     _vptr_TrackFileWriter < 0) {
          return this;
        }
        pMVar15 = Dictionary::Type((Dictionary *)ADesc->AudioSamplingRate,MDD_WAVEssence);
        RVar6 = *(Rational *)(pMVar15->ul + 8);
        ADesc[0x26].EditRate = *(Rational *)pMVar15->ul;
        ADesc[0x26].AudioSamplingRate = RVar6;
        *(undefined1 *)((long)&ADesc[0x26].AudioSamplingRate.Denominator + 3) = 1;
        if (ADesc[0x12].Locked == 1) {
          ADesc[0x12].Locked = 2;
          puVar16 = Kumu::RESULT_OK;
        }
        else {
          puVar16 = Kumu::RESULT_STATE;
        }
        Kumu::Result_t::Result_t((Result_t *)&stack0xffffffffffffff70,(Result_t *)puVar16);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff70);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff70);
        if (*(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                     _vptr_TrackFileWriter < 0) {
          return this;
        }
        pMVar15 = Dictionary::Type((Dictionary *)ADesc->AudioSamplingRate,MDD_WAVWrappingFrame);
        local_b0._M_string_length._0_1_ = 1;
        local_b0._9_8_ = *(undefined8 *)pMVar15->ul;
        local_b0.field_2._1_8_ = *(undefined8 *)(pMVar15->ul + 8);
        local_b0._M_dataplus._M_p = (pointer)&PTR__IArchive_0021d318;
        local_d0[8] = true;
        local_d0._9_8_ = ADesc[0x26].EditRate;
        RStack_bf = ADesc[0x26].AudioSamplingRate;
        local_d0._0_8_ = &PTR__IArchive_0021d318;
        pMVar15 = Dictionary::Type((Dictionary *)ADesc->AudioSamplingRate,MDD_SoundDataDef);
        local_f0[8] = 1;
        local_f0._9_8_ = *(undefined8 *)pMVar15->ul;
        uStack_df = *(undefined8 *)(pMVar15->ul + 8);
        local_f0._0_8_ = &PTR__IArchive_0021d318;
        local_100 = &PTR__IArchive_00222760;
        local_f8 = ADesc_00->EditRate;
        BytesPerEditUnit = derive_timecode_rate_from_edit_rate(&ADesc_00->EditRate);
        auVar17._0_8_ = (double)ADesc[0x25].AudioSamplingRate.Numerator;
        auVar17._8_8_ = (double)ADesc[0x25].EditRate.Numerator;
        dVar5 = (double)ADesc[0x25].EditRate.Denominator;
        auVar18._8_4_ = SUB84(dVar5,0);
        auVar18._0_8_ = (double)ADesc[0x25].AudioSamplingRate.Denominator;
        auVar18._12_4_ = (int)((ulong)dVar5 >> 0x20);
        auVar18 = divpd(auVar17,auVar18);
        ceil(auVar18._0_8_ / auVar18._8_8_);
        h__ASDCPWriter::WriteASDCPHeader
                  ((h__ASDCPWriter *)&stack0xffffffffffffff70,(string *)ADesc,
                   (UL *)&PCM_PACKAGE_LABEL_abi_cxx11_,&local_b0,(UL *)&SOUND_DEF_LABEL_abi_cxx11_,
                   (UL *)local_d0,(Rational *)local_f0,(ui32_t)&local_100,BytesPerEditUnit);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff70);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff70);
        return this;
      }
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      uVar3 = in_RDX[1].Numerator;
      uVar4 = in_RDX[1].Denominator;
      fmt = "AudioDescriptor.AudioSamplingRate is not 48000/1 or 96000/1: %d/%d\n";
    }
    else {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      uVar3 = in_RDX->Numerator;
      uVar4 = in_RDX->Denominator;
      fmt = "AudioDescriptor.EditRate is not a supported value: %d/%d\n";
    }
    Kumu::ILogSink::Error(this_00,fmt,(ulong)uVar3,(ulong)uVar4);
    puVar16 = ASDCP::RESULT_RAW_FORMAT;
  }
  else {
    puVar16 = Kumu::RESULT_STATE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar16);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::PCM::MXFWriter::h__Writer::SetSourceStream(const AudioDescriptor& ADesc)
{
  if ( ! m_State.Test_INIT() )
    return RESULT_STATE;

  if ( ADesc.EditRate != EditRate_24
       && ADesc.EditRate != EditRate_25
       && ADesc.EditRate != EditRate_30
       && ADesc.EditRate != EditRate_48
       && ADesc.EditRate != EditRate_50
       && ADesc.EditRate != EditRate_60
       && ADesc.EditRate != EditRate_96
       && ADesc.EditRate != EditRate_100
       && ADesc.EditRate != EditRate_120
       && ADesc.EditRate != EditRate_192
       && ADesc.EditRate != EditRate_200
       && ADesc.EditRate != EditRate_240
       && ADesc.EditRate != EditRate_16
       && ADesc.EditRate != EditRate_18
       && ADesc.EditRate != EditRate_20
       && ADesc.EditRate != EditRate_22
       && ADesc.EditRate != EditRate_23_98 )
    {
      DefaultLogSink().Error("AudioDescriptor.EditRate is not a supported value: %d/%d\n",
			     ADesc.EditRate.Numerator, ADesc.EditRate.Denominator);
      return RESULT_RAW_FORMAT;
    }

  if ( ADesc.AudioSamplingRate != SampleRate_48k && ADesc.AudioSamplingRate != SampleRate_96k )
    {
      DefaultLogSink().Error("AudioDescriptor.AudioSamplingRate is not 48000/1 or 96000/1: %d/%d\n",
			     ADesc.AudioSamplingRate.Numerator, ADesc.AudioSamplingRate.Denominator);
      return RESULT_RAW_FORMAT;
    }

  assert(m_Dict);
  m_ADesc = ADesc;

  Result_t result = PCM_ADesc_to_MD(m_ADesc, (WaveAudioDescriptor*)m_EssenceDescriptor);
  
  if ( ASDCP_SUCCESS(result) )
    {
      memcpy(m_EssenceUL, m_Dict->ul(MDD_WAVEssence), SMPTE_UL_LENGTH);
      m_EssenceUL[SMPTE_UL_LENGTH-1] = 1; // first (and only) essence container
      result = m_State.Goto_READY();
    }

  if ( ASDCP_SUCCESS(result) )
    {
      result = WriteASDCPHeader(PCM_PACKAGE_LABEL, UL(m_Dict->ul(MDD_WAVWrappingFrame)),
				SOUND_DEF_LABEL, UL(m_EssenceUL), UL(m_Dict->ul(MDD_SoundDataDef)),
				m_ADesc.EditRate, derive_timecode_rate_from_edit_rate(m_ADesc.EditRate),
				calc_CBR_frame_size(m_Info, m_ADesc));
    }

  return result;
}